

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void join(level *lev,int a,int b,boolean nxcor)

{
  char cVar1;
  char cVar2;
  schar ftyp;
  boolean bVar3;
  int iVar4;
  mkroom *aroom;
  mkroom *aroom_00;
  mkroom *pmVar5;
  mkroom *pmVar6;
  bool bVar7;
  int local_50;
  int iStack_4c;
  boolean splithalves;
  int dy;
  int dx;
  mkroom *touter;
  mkroom *couter;
  mkroom *troom;
  mkroom *croom;
  char local_20;
  coord local_1f;
  xchar yy;
  xchar xx;
  xchar ty;
  xchar tx;
  coord dest;
  coord org;
  coord tt;
  coord cc;
  boolean nxcor_local;
  int b_local;
  int a_local;
  level *lev_local;
  
  if (a != b) {
    aroom = lev->rooms + a;
    aroom_00 = lev->rooms + b;
    if (((-1 < aroom_00->hx) && (-1 < aroom->hx)) && (lev->doorindex < 0x78)) {
      dest.x = nxcor;
      unique0x10000621 = b;
      if (aroom->hx < aroom_00->lx) {
        iStack_4c = 1;
        local_50 = 0;
        croom._4_1_ = aroom->hx + '\x01';
        croom._6_1_ = aroom_00->lx + -1;
        bVar7 = false;
        if ((croom._4_1_ == croom._6_1_) && (bVar7 = false, aroom->ly == aroom_00->ly)) {
          bVar7 = aroom->hy == aroom_00->hy;
        }
        finddpos(lev,(coord *)&ty,croom._4_1_,aroom->ly,croom._4_1_,aroom->hy);
        finddpos(lev,(coord *)&yy,croom._6_1_,aroom_00->ly,croom._6_1_,aroom_00->hy);
      }
      else if (aroom_00->hy < aroom->ly) {
        iStack_4c = 0;
        local_50 = -1;
        croom._3_1_ = aroom->ly + -1;
        croom._5_1_ = aroom_00->hy + '\x01';
        bVar7 = false;
        if ((croom._3_1_ == croom._5_1_) && (bVar7 = false, aroom->lx == aroom_00->lx)) {
          bVar7 = aroom->hx == aroom_00->hx;
        }
        finddpos(lev,(coord *)&ty,aroom->lx,croom._3_1_,aroom->hx,croom._3_1_);
        finddpos(lev,(coord *)&yy,aroom_00->lx,croom._5_1_,aroom_00->hx,croom._5_1_);
      }
      else if (aroom_00->hx < aroom->lx) {
        iStack_4c = -1;
        local_50 = 0;
        croom._4_1_ = aroom->lx + -1;
        croom._6_1_ = aroom_00->hx + '\x01';
        bVar7 = false;
        if ((croom._4_1_ == croom._6_1_) && (bVar7 = false, aroom->ly == aroom_00->ly)) {
          bVar7 = aroom->hy == aroom_00->hy;
        }
        finddpos(lev,(coord *)&ty,croom._4_1_,aroom->ly,croom._4_1_,aroom->hy);
        finddpos(lev,(coord *)&yy,croom._6_1_,aroom_00->ly,croom._6_1_,aroom_00->hy);
      }
      else {
        iStack_4c = 0;
        local_50 = 1;
        croom._3_1_ = aroom->hy + '\x01';
        croom._5_1_ = aroom_00->ly + -1;
        bVar7 = false;
        if ((croom._3_1_ == croom._5_1_) && (bVar7 = false, aroom->lx == aroom_00->lx)) {
          bVar7 = aroom->hx == aroom_00->hx;
        }
        finddpos(lev,(coord *)&ty,aroom->lx,croom._3_1_,aroom->hx,croom._3_1_);
        finddpos(lev,(coord *)&yy,aroom_00->lx,croom._5_1_,aroom_00->hx,croom._5_1_);
      }
      cVar1 = (char)iStack_4c;
      cVar2 = (char)local_50;
      if (!bVar7) {
        pmVar5 = pos_to_room(lev,ty + cVar1,tx + cVar2);
        pmVar6 = pos_to_room(lev,yy - cVar1,xx - cVar2);
        if ((pmVar5 != (mkroom *)0x0) &&
           (((long)pmVar5 - (long)lev->rooms) / 0xd8 != (long)stack0xffffffffffffffe8)) {
          join(lev,(int)(((long)pmVar5 - (long)lev->rooms) / 0xd8),stack0xffffffffffffffe8,dest.x);
          return;
        }
        if ((pmVar6 != (mkroom *)0x0) && (((long)pmVar6 - (long)lev->rooms) / 0xd8 != (long)a)) {
          join(lev,a,(int)(((long)pmVar6 - (long)lev->rooms) / 0xd8),dest.x);
          return;
        }
      }
      croom._4_1_ = ty;
      croom._3_1_ = tx;
      croom._6_1_ = yy - cVar1;
      croom._5_1_ = xx - cVar2;
      if (((dest.x == '\0') || (lev->locations[ty + iStack_4c][tx + local_50].typ == '\0')) ||
         (bVar7)) {
        iVar4 = okdoor(lev,ty,tx);
        if ((iVar4 != 0) || (dest.x == '\0')) {
          dodoor(lev,(int)croom._4_1_,(int)croom._3_1_,aroom);
        }
        if (bVar7) {
          add_door(lev,(int)croom._4_1_,(int)croom._3_1_,aroom_00);
        }
        else {
          local_1f.x = croom._4_1_ + cVar1;
          local_1f.y = croom._3_1_ + cVar2;
          croom._7_1_ = croom._6_1_;
          local_20 = croom._5_1_;
          ftyp = '\x18';
          if ((*(uint *)&(lev->flags).field_0x8 >> 0x14 & 1) != 0) {
            ftyp = '\x19';
          }
          bVar3 = dig_corridor(lev,&local_1f,(coord *)((long)&croom + 7),dest.x,ftyp,'\0');
          if (bVar3 == '\0') {
            if (dest.x != '\0') {
              return;
            }
            warning("failed to dig required corridor");
            return;
          }
          iVar4 = okdoor(lev,yy,xx);
          if ((iVar4 != 0) || (dest.x == '\0')) {
            dodoor(lev,(int)yy,(int)xx,aroom_00);
          }
        }
        if (smeq[a] < smeq[stack0xffffffffffffffe8]) {
          smeq[stack0xffffffffffffffe8] = smeq[a];
        }
        else {
          smeq[a] = smeq[stack0xffffffffffffffe8];
        }
      }
    }
  }
  return;
}

Assistant:

static void join(struct level *lev, int a, int b, boolean nxcor)
{
	coord cc,tt, org, dest;
	xchar tx, ty, xx, yy;
	struct mkroom *croom, *troom;
	struct mkroom *couter, *touter;
	int dx, dy;
	boolean splithalves;	/* we're joining two halves of a split room */

	if (a == b) return;

	croom = &lev->rooms[a];
	troom = &lev->rooms[b];

	/* find positions cc and tt for doors in croom and troom
	   and direction for a corridor between them */

	if (troom->hx < 0 || croom->hx < 0 || lev->doorindex >= DOORMAX) return;
	if (troom->lx > croom->hx) {
		/* t is right of c */
		dx =  1;
		dy =  0;
		xx = croom->hx+1;
		tx = troom->lx-1;
		splithalves = xx == tx &&
			      croom->ly == troom->ly &&
			      croom->hy == troom->hy;
		finddpos(lev, &cc, xx, croom->ly, xx, croom->hy);
		finddpos(lev, &tt, tx, troom->ly, tx, troom->hy);
	} else if (troom->hy < croom->ly) {
		/* t is above c */
		dx =  0;
		dy = -1;
		yy = croom->ly-1;
		ty = troom->hy+1;
		splithalves = yy == ty &&
			      croom->lx == troom->lx &&
			      croom->hx == troom->hx;
		finddpos(lev, &cc, croom->lx, yy, croom->hx, yy);
		finddpos(lev, &tt, troom->lx, ty, troom->hx, ty);
	} else if (troom->hx < croom->lx) {
		/* t is left of c */
		dx = -1;
		dy =  0;
		xx = croom->lx-1;
		tx = troom->hx+1;
		splithalves = xx == tx &&
			      croom->ly == troom->ly &&
			      croom->hy == troom->hy;
		finddpos(lev, &cc, xx, croom->ly, xx, croom->hy);
		finddpos(lev, &tt, tx, troom->ly, tx, troom->hy);
	} else {
		/* t should be below c */
		dx =  0;
		dy =  1;
		yy = croom->hy+1;
		ty = troom->ly-1;
		splithalves = yy == ty &&
			      croom->lx == troom->lx &&
			      croom->hx == troom->hx;
		finddpos(lev, &cc, croom->lx, yy, croom->hx, yy);
		finddpos(lev, &tt, troom->lx, ty, troom->hx, ty);
	}

	if (!splithalves) {
	    /* two halves of a split room should be connected, so if another
	       room (itself split or otherwise) tries to connect to one of the
	       halves via its unreachable middle wall, proxy the join to the
	       other half, which should be positioned better for the join */
	    couter = pos_to_room(lev, cc.x+dx, cc.y+dy);
	    touter = pos_to_room(lev, tt.x-dx, tt.y-dy);
	    if (couter && couter - lev->rooms != b) {
		    join(lev, couter - lev->rooms, b, nxcor);
		    return;
	    }
	    if (touter && touter - lev->rooms != a) {
		    join(lev, a, touter - lev->rooms, nxcor );
		    return;
	    }
	}

	xx = cc.x;
	yy = cc.y;
	tx = tt.x - dx;
	ty = tt.y - dy;
	if (nxcor && lev->locations[xx+dx][yy+dy].typ && !splithalves)
		return;
	if (okdoor(lev, xx, yy) || !nxcor)
		dodoor(lev, xx, yy, croom);

	if (splithalves) {
		/* common door already made, so just do bookkeeping */
		add_door(lev, xx, yy, troom);
	} else {
		org.x  = xx+dx;
		org.y  = yy+dy;
		dest.x = tx;
		dest.y = ty;

		if (!dig_corridor(lev, &org, &dest, nxcor,
				  lev->flags.arboreal ? ROOM : CORR, STONE)) {
			if (!nxcor)
				warning("failed to dig required corridor");
			return;
		}

		/* we succeeded in digging the corridor */
		if (okdoor(lev, tt.x, tt.y) || !nxcor)
			dodoor(lev, tt.x, tt.y, troom);
	}

	if (smeq[a] < smeq[b])
		smeq[b] = smeq[a];
	else
		smeq[a] = smeq[b];
}